

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O1

void subr_settime(LispPTR *args)

{
  uint uVar1;
  timeval timev;
  timeval local_18;
  
  uVar1 = *args;
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n");
  }
  local_18.tv_sec = (__time_t)(*(int *)(Lisp_world + uVar1) + 0x7e36b500);
  local_18.tv_usec = 0;
  settimeofday(&local_18,(timezone *)0x0);
  return;
}

Assistant:

void subr_settime(LispPTR args[])
{
#ifdef DOS
  struct dostime_t dostime;
  struct dosdate_t dosday;
  struct tm uxtime;

  uxtime = *localtime((time_t *)(*((int *)NativeAligned4FromLAddr(args[0])) - UNIX_ALTO_TIME_DIFF));
  dostime.hsecond = 0;
  dostime.second = uxtime.tm_sec;
  dostime.minute = uxtime.tm_min;
  dostime.hour = uxtime.tm_hour;
  _dos_settime(&dostime);

  dosday.day = uxtime.tm_mday;
  dosday.month = uxtime.tm_mon;
  dosday.year = uxtime.tm_year;
  dosday.dayofweek = uxtime.tm_wday;
  _dos_setdate(&dosday);
#elif defined(MAIKO_OS_HAIKU)
  (void)args[0];
#elif defined(MAIKO_OS_EMSCRIPTEN)
  (void)args[0];
#else
  struct timeval timev;
  timev.tv_sec = *((int *)NativeAligned4FromLAddr(args[0])) - UNIX_ALTO_TIME_DIFF;
  timev.tv_usec = 0;
  settimeofday(&timev, NULL);
#endif
}